

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::SetItem
               (Var receiver,RecyclableObject *object,uint64 index,Var value,
               ScriptContext *scriptContext,PropertyOperationFlags propertyOperationFlags)

{
  uint64 object_00;
  RecyclableObject *instance;
  PropertyId propertyId;
  BOOL BVar1;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  ScriptContext *pSStack_30;
  PropertyOperationFlags propertyOperationFlags_local;
  ScriptContext *scriptContext_local;
  Var value_local;
  uint64 index_local;
  RecyclableObject *object_local;
  Var receiver_local;
  
  local_40 = (PropertyRecord *)0x0;
  propertyRecord._4_4_ = propertyOperationFlags;
  pSStack_30 = scriptContext;
  scriptContext_local = (ScriptContext *)value;
  value_local = (Var)index;
  index_local = (uint64)object;
  object_local = (RecyclableObject *)receiver;
  GetPropertyIdForInt(index,scriptContext,&local_40);
  instance = object_local;
  object_00 = index_local;
  propertyId = PropertyRecord::GetPropertyId(local_40);
  BVar1 = SetProperty(instance,(RecyclableObject *)object_00,propertyId,scriptContext_local,
                      pSStack_30,propertyRecord._4_4_);
  return BVar1;
}

Assistant:

BOOL JavascriptOperators::SetItem(Var receiver, RecyclableObject* object, uint64 index, Var value, ScriptContext* scriptContext, PropertyOperationFlags propertyOperationFlags)
    {
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptOperators::GetPropertyIdForInt(index, scriptContext, &propertyRecord);
        return JavascriptOperators::SetProperty(receiver, object, propertyRecord->GetPropertyId(), value, scriptContext, propertyOperationFlags);
    }